

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O1

void __thiscall Centaurus::DFA<char>::minimize(DFA<char> *this)

{
  bool *pbVar1;
  int iVar2;
  pointer pDVar3;
  pointer pNVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pDVar8;
  iterator iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  iterator __begin0;
  pointer pDVar13;
  pointer pNVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  vector<bool,_std::allocator<bool>_> mask;
  vector<int,_std::allocator<int>_> remap;
  unordered_map<Centaurus::DFAState<char>,_int,_std::hash<Centaurus::DFAState<char>_>,_std::equal_to<Centaurus::DFAState<char>_>,_std::allocator<std::pair<const_Centaurus::DFAState<char>,_int>_>_>
  equiv_map;
  int local_ac;
  vector<bool,_std::allocator<bool>_> local_a8;
  vector<int,_std::allocator<int>_> local_80;
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  local_68[0] = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a8,
             ((long)(this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (bool *)local_68,(allocator_type *)&local_80);
  local_68._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_80,
             ((long)(this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (value_type_conflict *)local_68,(allocator_type *)&local_ac);
  local_68._0_8_ = local_40 + 8;
  local_68._8_8_ = 1;
  local_68._16_16_ = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  local_ac = 0;
  pDVar8 = (this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
      super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pDVar8) {
    uVar11 = 0;
  }
  else {
    uVar10 = 0;
    do {
      iVar9 = std::
              _Hashtable<Centaurus::DFAState<char>,_std::pair<const_Centaurus::DFAState<char>,_int>,_std::allocator<std::pair<const_Centaurus::DFAState<char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::DFAState<char>_>,_std::hash<Centaurus::DFAState<char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<Centaurus::DFAState<char>,_std::pair<const_Centaurus::DFAState<char>,_int>,_std::allocator<std::pair<const_Centaurus::DFAState<char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::DFAState<char>_>,_std::hash<Centaurus::DFAState<char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_68,pDVar8 + uVar10);
      if (iVar9.super__Node_iterator_base<std::pair<const_Centaurus::DFAState<char>,_int>,_true>.
          _M_cur == (__node_type *)0x0) {
        std::
        _Hashtable<Centaurus::DFAState<char>,std::pair<Centaurus::DFAState<char>const,int>,std::allocator<std::pair<Centaurus::DFAState<char>const,int>>,std::__detail::_Select1st,std::equal_to<Centaurus::DFAState<char>>,std::hash<Centaurus::DFAState<char>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<Centaurus::DFAState<char>&,int&>
                  ((_Hashtable<Centaurus::DFAState<char>,std::pair<Centaurus::DFAState<char>const,int>,std::allocator<std::pair<Centaurus::DFAState<char>const,int>>,std::__detail::_Select1st,std::equal_to<Centaurus::DFAState<char>>,std::hash<Centaurus::DFAState<char>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_68,
                   (this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                   super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_ac,&local_ac);
      }
      else {
        iVar2 = *(int *)((long)iVar9.
                               super__Node_iterator_base<std::pair<const_Centaurus::DFAState<char>,_int>,_true>
                               ._M_cur + 0x50);
        pDVar8 = (this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                 super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = &pDVar8[iVar2].m_long;
        *pbVar1 = (bool)(*pbVar1 | pDVar8[local_ac].m_long);
        local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_ac] = iVar2;
        uVar10 = (ulong)local_ac;
        uVar11 = uVar10 + 0x3f;
        if (-1 < (long)uVar10) {
          uVar11 = uVar10;
        }
        bVar5 = (byte)local_ac & 0x3f;
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar11 >> 6) + ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar11 >> 6) +
              ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
             (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar10 = (long)local_ac + 1;
      local_ac = (int)uVar10;
      pDVar8 = (this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
               super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
                      super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar8 >> 3) *
               -0x71c71c71c71c71c7;
    } while (uVar10 <= uVar11 && uVar11 - uVar10 != 0);
  }
  if (uVar11 != 0) {
    pDVar3 = (this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
             super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar10 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx512f(_DAT_0016d040);
    auVar21 = vpmovsxwd_avx512f(_DAT_0016d060);
    do {
      if (-1 < local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10] && pDVar8 != pDVar3) {
        auVar22 = vpbroadcastq_avx512f();
        auVar23 = vpbroadcastd_avx512f();
        pDVar13 = pDVar8;
        do {
          pNVar14 = (pDVar13->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions.
                    super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar4 = (pDVar13->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions.
                   super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pNVar14 != pNVar4) {
            uVar12 = (ulong)((long)pNVar4 + (-0x38 - (long)pNVar14)) / 0x38 + 0x10 &
                     0xfffffffffffffff0;
            auVar24 = vpbroadcastq_avx512f();
            uVar15 = 0;
            do {
              auVar25 = vpbroadcastq_avx512f();
              auVar26 = vporq_avx512f(auVar25,auVar19);
              auVar25 = vporq_avx512f(auVar25,auVar20);
              uVar6 = vpcmpuq_avx512f(auVar25,auVar24,2);
              uVar7 = vpcmpuq_avx512f(auVar26,auVar24,2);
              bVar5 = (byte)uVar7;
              uVar16 = CONCAT11(bVar5,(byte)uVar6);
              auVar25 = vpgatherdd_avx512f(*(undefined4 *)((long)&pNVar14->m_dest + uVar12));
              auVar17._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar25._4_4_;
              auVar17._0_4_ = (uint)((byte)uVar6 & 1) * auVar25._0_4_;
              auVar17._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar25._8_4_;
              auVar17._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar25._12_4_;
              auVar17._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar25._16_4_;
              auVar17._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar25._20_4_;
              auVar17._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar25._24_4_;
              auVar17._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar25._28_4_;
              auVar26._32_4_ = (uint)(bVar5 & 1) * auVar25._32_4_;
              auVar26._0_32_ = auVar17;
              auVar26._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar25._36_4_;
              auVar26._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar25._40_4_;
              auVar26._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar25._44_4_;
              auVar26._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar25._48_4_;
              auVar26._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar25._52_4_;
              auVar26._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar25._56_4_;
              auVar26._60_4_ = (uint)(bVar5 >> 7) * auVar25._60_4_;
              auVar18 = vextracti64x4_avx512f(auVar26,1);
              auVar25 = vpmovzxdq_avx512f(auVar18);
              auVar26 = vpmovzxdq_avx512f(auVar17);
              uVar6 = vpcmpeqq_avx512f(auVar22,auVar26);
              uVar7 = vpcmpeqq_avx512f(auVar22,auVar25);
              vpscatterdd_avx512f(ZEXT864(pNVar14) + auVar21,
                                  (ulong)(uVar16 & CONCAT11((char)uVar7,(char)uVar6)),auVar23);
              uVar15 = uVar15 + 0x10;
              pNVar14 = pNVar14 + 0x10;
            } while (uVar12 != uVar15);
          }
          pDVar13 = pDVar13 + 1;
        } while (pDVar13 != pDVar3);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar11);
  }
  filter_nodes(this,&local_a8);
  std::
  _Hashtable<Centaurus::DFAState<char>,_std::pair<const_Centaurus::DFAState<char>,_int>,_std::allocator<std::pair<const_Centaurus::DFAState<char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::DFAState<char>_>,_std::hash<Centaurus::DFAState<char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Centaurus::DFAState<char>,_std::pair<const_Centaurus::DFAState<char>,_int>,_std::allocator<std::pair<const_Centaurus::DFAState<char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::DFAState<char>_>,_std::hash<Centaurus::DFAState<char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_68);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void minimize()
    {
        std::vector<bool> mask(m_states.size(), true);
        std::vector<int> remap(m_states.size(), -1);

        std::unordered_map<DFAState<TCHAR>, int> equiv_map;

        for (int index = 0; index < m_states.size(); index++)
        {
            auto p = equiv_map.find(m_states[index]);
            if (p != equiv_map.end())
            {
                m_states[p->second].set_long(m_states[index].is_long());
                remap[index] = p->second;
                mask[index] = false;
            }
            else
            {
                equiv_map.emplace(m_states[index], index);
            }
        }

        for (int index = 0; index < m_states.size(); index++)
        {
            if (remap[index] >= 0)
            {
                redirect_transitions(index, remap[index]);
            }
        }
        filter_nodes(mask);
    }